

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawPixelV(Vector2 position,Color color)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 local_68;
  undefined4 uStack_64;
  
  rlSetTexture(texShapes.id);
  uVar2 = texShapesRec._8_8_;
  uVar1 = texShapesRec._0_8_;
  rlBegin(7);
  rlNormal3f(0.0,0.0,1.0);
  rlColor4ub(color.r,color.g,color.b,color.a);
  local_78 = (float)uVar1;
  uStack_74 = SUB84(uVar1,4);
  rlTexCoord2f(local_78 / (float)texShapes.width,uStack_74 / (float)texShapes.height);
  local_88 = position.x;
  uStack_84 = position.y;
  rlVertex2f(local_88,uStack_84);
  local_68 = (float)uVar2;
  uStack_64 = SUB84(uVar2,4);
  rlTexCoord2f(local_78 / (float)texShapes.width,(uStack_64 + uStack_74) / (float)texShapes.height);
  rlVertex2f(local_88,uStack_84 + 1.0);
  rlTexCoord2f((local_68 + local_78) / (float)texShapes.width,
               (uStack_64 + uStack_74) / (float)texShapes.height);
  rlVertex2f(local_88 + 1.0,uStack_84 + 1.0);
  rlTexCoord2f((local_68 + local_78) / (float)texShapes.width,uStack_74 / (float)texShapes.height);
  rlVertex2f(local_88 + 1.0,uStack_84);
  rlEnd();
  rlSetTexture(0);
  return;
}

Assistant:

void DrawPixelV(Vector2 position, Color color)
{
#if defined(SUPPORT_QUADS_DRAW_MODE)
    rlSetTexture(GetShapesTexture().id);
    Rectangle shapeRect = GetShapesTextureRectangle();

    rlBegin(RL_QUADS);

        rlNormal3f(0.0f, 0.0f, 1.0f);
        rlColor4ub(color.r, color.g, color.b, color.a);

        rlTexCoord2f(shapeRect.x/texShapes.width, shapeRect.y/texShapes.height);
        rlVertex2f(position.x, position.y);

        rlTexCoord2f(shapeRect.x/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
        rlVertex2f(position.x, position.y + 1);

        rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, (shapeRect.y + shapeRect.height)/texShapes.height);
        rlVertex2f(position.x + 1, position.y + 1);

        rlTexCoord2f((shapeRect.x + shapeRect.width)/texShapes.width, shapeRect.y/texShapes.height);
        rlVertex2f(position.x + 1, position.y);

    rlEnd();

    rlSetTexture(0);
#else
    rlBegin(RL_TRIANGLES);

        rlColor4ub(color.r, color.g, color.b, color.a);

        rlVertex2f(position.x, position.y);
        rlVertex2f(position.x, position.y + 1);
        rlVertex2f(position.x + 1, position.y);

        rlVertex2f(position.x + 1, position.y);
        rlVertex2f(position.x, position.y + 1);
        rlVertex2f(position.x + 1, position.y + 1);

    rlEnd();
#endif
}